

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void emit_GLSL_attribute(Context *ctx,RegisterType regtype,int regnum,MOJOSHADER_usage usage,
                        int index,int wmask,int flags)

{
  int iVar1;
  char local_98 [4];
  MiscTypeType mt;
  char var [64];
  char index_str [16];
  char *local_40;
  char *arrayright;
  char *arrayleft;
  char *usage_str;
  uint local_20;
  int wmask_local;
  int index_local;
  MOJOSHADER_usage usage_local;
  int regnum_local;
  RegisterType regtype_local;
  Context *ctx_local;
  
  arrayleft = (char *)0x0;
  arrayright = "";
  local_40 = "";
  memset(var + 0x38,0,0x10);
  get_GLSL_varname_in_buf(ctx,regtype,regnum,local_98,0x40);
  if (index != 0) {
    snprintf(var + 0x38,0x10,"%u",(ulong)(uint)index);
  }
  iVar1 = shader_is_vertex(ctx);
  if (iVar1 == 0) {
    iVar1 = shader_is_pixel(ctx);
    if (iVar1 == 0) {
      fail(ctx,"Unknown shader type");
    }
    else if ((flags & 4U) == 0) {
      if (regtype == REG_TYPE_COLOROUT) {
        if (ctx->have_multi_color_outputs == 0) {
          arrayleft = "gl_FragColor";
        }
        else {
          snprintf(var + 0x38,0x10,"%u",(ulong)(uint)regnum);
          arrayleft = "gl_FragData";
          arrayright = "[";
          local_40 = "]";
        }
      }
      else if (regtype == REG_TYPE_DEPTHOUT) {
        arrayleft = "gl_FragDepth";
      }
      else if ((regtype == REG_TYPE_ADDRESS) || (regtype == REG_TYPE_INPUT)) {
        if (usage == MOJOSHADER_USAGE_TEXCOORD) {
          iVar1 = shader_version_atleast(ctx,'\x01','\x04');
          if (iVar1 != 0) {
            snprintf(var + 0x38,0x10,"%u",(ulong)(uint)index);
            if (ctx->profile_supports_glsles == 0) {
              arrayleft = "gl_TexCoord";
            }
            else {
              arrayleft = "v_TexCoord";
            }
            arrayright = "[";
            local_40 = "]";
          }
        }
        else if (usage == MOJOSHADER_USAGE_COLOR) {
          var[0x38] = '\0';
          if (index == 0) {
            if (ctx->profile_supports_glsles == 0) {
              arrayleft = "gl_Color";
            }
            else {
              arrayleft = "v_FrontColor";
            }
          }
          else if (index == 1) {
            if (ctx->profile_supports_glsles == 0) {
              arrayleft = "gl_SecondaryColor";
            }
            else {
              arrayleft = "v_FrontSecondaryColor";
            }
          }
        }
      }
      else if (regtype == REG_TYPE_MISCTYPE) {
        if (regnum == 1) {
          push_output(ctx,&ctx->globals);
          output_line(ctx,"float %s = gl_FrontFacing ? 1.0 : -1.0;",local_98);
          pop_output(ctx);
        }
        else if (regnum == 0) {
          var[0x38] = '\0';
          arrayleft = "gl_FragCoord";
        }
        else {
          fail(ctx,"BUG: unhandled misc register");
        }
      }
      else {
        fail(ctx,"unknown pixel shader attribute register");
      }
      push_output(ctx,&ctx->globals);
      if (arrayleft == (char *)0x0) {
        if (ctx->profile_supports_glsles == 0) {
          output_line(ctx,"varying vec4 io_%i_%i;",(ulong)(uint)usage,(ulong)(uint)index);
        }
        else {
          output_line(ctx,"varying highp vec4 io_%i_%i;",(ulong)(uint)usage,(ulong)(uint)index);
        }
        output_line(ctx,"#define %s io_%i_%i",local_98,(ulong)(uint)usage,(ulong)(uint)index);
      }
      else {
        output_line(ctx,"#define %s %s%s%s%s",local_98,arrayleft,arrayright,var + 0x38,local_40);
      }
      pop_output(ctx);
    }
    else {
      failf(ctx,"centroid unsupported in %s profile",ctx->profile->name);
    }
  }
  else {
    iVar1 = shader_version_atleast(ctx,'\x03','\0');
    local_20 = index;
    wmask_local = usage;
    usage_local = regtype;
    if (iVar1 == 0) {
      local_20 = regnum;
      if (regtype == REG_TYPE_RASTOUT) {
        usage_local = MOJOSHADER_USAGE_TANGENT;
        if (regnum == 0) {
          wmask_local = 0;
        }
        else if (regnum == 1) {
          wmask_local = 0xb;
        }
        else if (regnum == 2) {
          wmask_local = 4;
        }
      }
      else if (regtype == REG_TYPE_ATTROUT) {
        usage_local = MOJOSHADER_USAGE_TANGENT;
        wmask_local = 10;
      }
      else {
        local_20 = index;
        if (regtype == REG_TYPE_OUTPUT) {
          usage_local = MOJOSHADER_USAGE_TANGENT;
          wmask_local = 5;
          local_20 = regnum;
        }
      }
    }
    if (usage_local == MOJOSHADER_USAGE_BLENDWEIGHT) {
      push_output(ctx,&ctx->globals);
      output_line(ctx,"attribute vec4 %s;",local_98);
      pop_output(ctx);
    }
    else if (usage_local == MOJOSHADER_USAGE_TANGENT) {
      switch(wmask_local) {
      case 0:
        arrayleft = "gl_Position";
        break;
      default:
        break;
      case 4:
        arrayleft = "gl_PointSize";
        break;
      case 5:
        snprintf(var + 0x38,0x10,"%u",(ulong)local_20);
        if (ctx->profile_supports_glsles == 0) {
          arrayleft = "gl_TexCoord";
        }
        else {
          arrayleft = "v_TexCoord";
        }
        arrayright = "[";
        local_40 = "]";
        break;
      case 10:
        var[0x38] = '\0';
        if (local_20 == 0) {
          if (ctx->profile_supports_glsles == 0) {
            arrayleft = "gl_FrontColor";
          }
          else {
            arrayleft = "v_FrontColor";
          }
        }
        else if (local_20 == 1) {
          if (ctx->profile_supports_glsles == 0) {
            arrayleft = "gl_FrontSecondaryColor";
          }
          else {
            arrayleft = "v_FrontSecondaryColor";
          }
        }
        break;
      case 0xb:
        arrayleft = "gl_FogFragCoord";
      }
      push_output(ctx,&ctx->globals);
      if (arrayleft == (char *)0x0) {
        if (ctx->profile_supports_glsles == 0) {
          output_line(ctx,"varying vec4 io_%i_%i;",(ulong)(uint)wmask_local,(ulong)local_20);
        }
        else {
          output_line(ctx,"varying highp vec4 io_%i_%i;",(ulong)(uint)wmask_local,(ulong)local_20);
        }
        output_line(ctx,"#define %s io_%i_%i",local_98,(ulong)(uint)wmask_local,(ulong)local_20);
      }
      else {
        output_line(ctx,"#define %s %s%s%s%s",local_98,arrayleft,arrayright,var + 0x38,local_40);
      }
      pop_output(ctx);
    }
    else {
      fail(ctx,"unknown vertex shader attribute register");
    }
  }
  return;
}

Assistant:

static void emit_GLSL_attribute(Context *ctx, RegisterType regtype, int regnum,
                                MOJOSHADER_usage usage, int index, int wmask,
                                int flags)
{
    // !!! FIXME: this function doesn't deal with write masks at all yet!
    const char *usage_str = NULL;
    const char *arrayleft = "";
    const char *arrayright = "";
    char index_str[16] = { '\0' };
    char var[64];

    get_GLSL_varname_in_buf(ctx, regtype, regnum, var, sizeof (var));

    //assert((flags & MOD_PP) == 0);  // !!! FIXME: is PP allowed?

    if (index != 0)  // !!! FIXME: a lot of these MUST be zero.
        snprintf(index_str, sizeof (index_str), "%u", (uint) index);

    if (shader_is_vertex(ctx))
    {
        // pre-vs3 output registers.
        // these don't ever happen in DCL opcodes, I think. Map to vs_3_*
        //  output registers.
        if (!shader_version_atleast(ctx, 3, 0))
        {
            if (regtype == REG_TYPE_RASTOUT)
            {
                regtype = REG_TYPE_OUTPUT;
                index = regnum;
                switch ((const RastOutType) regnum)
                {
                    case RASTOUT_TYPE_POSITION:
                        usage = MOJOSHADER_USAGE_POSITION;
                        break;
                    case RASTOUT_TYPE_FOG:
                        usage = MOJOSHADER_USAGE_FOG;
                        break;
                    case RASTOUT_TYPE_POINT_SIZE:
                        usage = MOJOSHADER_USAGE_POINTSIZE;
                        break;
                } // switch
            } // if

            else if (regtype == REG_TYPE_ATTROUT)
            {
                regtype = REG_TYPE_OUTPUT;
                usage = MOJOSHADER_USAGE_COLOR;
                index = regnum;
            } // else if

            else if (regtype == REG_TYPE_TEXCRDOUT)
            {
                regtype = REG_TYPE_OUTPUT;
                usage = MOJOSHADER_USAGE_TEXCOORD;
                index = regnum;
            } // else if
        } // if

        // to avoid limitations of various GL entry points for input
        // attributes (glSecondaryColorPointer() can only take 3 component
        // items, glVertexPointer() can't do GL_UNSIGNED_BYTE, many other
        // issues), we set up all inputs as generic vertex attributes, so we
        // can pass data in just about any form, and ignore the built-in GLSL
        // attributes like gl_SecondaryColor. Output needs to use the the
        // built-ins, though, but we don't have to worry about the GL entry
        // point limitations there.

        if (regtype == REG_TYPE_INPUT)
        {
            push_output(ctx, &ctx->globals);
            output_line(ctx, "attribute vec4 %s;", var);
            pop_output(ctx);
        } // if

        else if (regtype == REG_TYPE_OUTPUT)
        {
            switch (usage)
            {
                case MOJOSHADER_USAGE_POSITION:
                    usage_str = "gl_Position";
                    break;
                case MOJOSHADER_USAGE_POINTSIZE:
                    usage_str = "gl_PointSize";
                    break;
                case MOJOSHADER_USAGE_COLOR:
                    index_str[0] = '\0';  // no explicit number.
                    if (index == 0)
                    {
#if SUPPORT_PROFILE_GLSLES
                        if (support_glsles(ctx))
                            usage_str = "v_FrontColor";
                        else
#endif
                        usage_str = "gl_FrontColor";
                    } // if
                    else if (index == 1)
                    {
#if SUPPORT_PROFILE_GLSLES
                        if (support_glsles(ctx))
                            usage_str = "v_FrontSecondaryColor";
                        else
#endif
                        usage_str = "gl_FrontSecondaryColor";
                    } // else if
                    break;
                case MOJOSHADER_USAGE_FOG:
                    usage_str = "gl_FogFragCoord";
                    break;
                case MOJOSHADER_USAGE_TEXCOORD:
                    snprintf(index_str, sizeof (index_str), "%u", (uint) index);
#if SUPPORT_PROFILE_GLSLES
                    if (support_glsles(ctx))
                        usage_str = "v_TexCoord";
                    else
#endif
                    usage_str = "gl_TexCoord";
                    arrayleft = "[";
                    arrayright = "]";
                    break;
                default:
                    // !!! FIXME: we need to deal with some more built-in varyings here.
                    break;
            } // switch

            // !!! FIXME: the #define is a little hacky, but it means we don't
            // !!! FIXME:  have to track these separately if this works.
            push_output(ctx, &ctx->globals);
            // no mapping to built-in var? Just make it a regular global, pray.
            if (usage_str == NULL)
            {
#if SUPPORT_PROFILE_GLSLES
                if (support_glsles(ctx))
                    output_line(ctx, "varying highp vec4 io_%i_%i;", usage, index);
                else
#endif
                output_line(ctx, "varying vec4 io_%i_%i;", usage, index);
                output_line(ctx, "#define %s io_%i_%i", var, usage, index);
            } // if
            else
            {
                output_line(ctx, "#define %s %s%s%s%s", var, usage_str,
                            arrayleft, index_str, arrayright);
            } // else
            pop_output(ctx);
        } // else if

        else
        {
            fail(ctx, "unknown vertex shader attribute register");
        } // else
    } // if

    else if (shader_is_pixel(ctx))
    {
        // samplers DCLs get handled in emit_GLSL_sampler().

        if (flags & MOD_CENTROID)  // !!! FIXME
        {
            failf(ctx, "centroid unsupported in %s profile", ctx->profile->name);
            return;
        } // if

        if (regtype == REG_TYPE_COLOROUT)
        {
            if (!ctx->have_multi_color_outputs)
                usage_str = "gl_FragColor";  // maybe faster?
            else
            {
                snprintf(index_str, sizeof (index_str), "%u", (uint) regnum);
                usage_str = "gl_FragData";
                arrayleft = "[";
                arrayright = "]";
            } // else
        } // if

        else if (regtype == REG_TYPE_DEPTHOUT)
            usage_str = "gl_FragDepth";

        // !!! FIXME: can you actualy have a texture register with COLOR usage?
        else if ((regtype == REG_TYPE_TEXTURE) || (regtype == REG_TYPE_INPUT))
        {
            if (usage == MOJOSHADER_USAGE_TEXCOORD)
            {
                // ps_1_1 does a different hack for this attribute.
                //  Refer to emit_GLSL_global()'s REG_TYPE_ADDRESS code.
                if (shader_version_atleast(ctx, 1, 4))
                {
                    snprintf(index_str, sizeof (index_str), "%u", (uint) index);
#if SUPPORT_PROFILE_GLSLES
                    if (support_glsles(ctx))
                        usage_str = "v_TexCoord";
                    else
#endif
                    usage_str = "gl_TexCoord";
                    arrayleft = "[";
                    arrayright = "]";
                } // if
            } // if

            else if (usage == MOJOSHADER_USAGE_COLOR)
            {
                index_str[0] = '\0';  // no explicit number.
                if (index == 0)
                {
#if SUPPORT_PROFILE_GLSLES
                    if (support_glsles(ctx))
                        usage_str = "v_FrontColor";
                    else
#endif
                    usage_str = "gl_Color";
                } // if
                else if (index == 1)
                {
#if SUPPORT_PROFILE_GLSLES
                    if (support_glsles(ctx))
                        usage_str = "v_FrontSecondaryColor";
                    else
#endif
                    usage_str = "gl_SecondaryColor";
                } // else if
                // FIXME: Does this even matter when we have varyings? -flibit
                // else
                //    fail(ctx, "unsupported color index");
            } // else if
        } // else if

        else if (regtype == REG_TYPE_MISCTYPE)
        {
            const MiscTypeType mt = (MiscTypeType) regnum;
            if (mt == MISCTYPE_TYPE_FACE)
            {
                push_output(ctx, &ctx->globals);
                output_line(ctx, "float %s = gl_FrontFacing ? 1.0 : -1.0;", var);
                pop_output(ctx);
            } // if
            else if (mt == MISCTYPE_TYPE_POSITION)
            {
                index_str[0] = '\0';  // no explicit number.
                usage_str = "gl_FragCoord";  // !!! FIXME: is this the same coord space as D3D?
            } // else if
            else
            {
                fail(ctx, "BUG: unhandled misc register");
            } // else
        } // else if

        else
        {
            fail(ctx, "unknown pixel shader attribute register");
        } // else

        push_output(ctx, &ctx->globals);
        // no mapping to built-in var? Just make it a regular global, pray.
        if (usage_str == NULL)
        {
#if SUPPORT_PROFILE_GLSLES
            if (support_glsles(ctx))
                output_line(ctx, "varying highp vec4 io_%i_%i;", usage, index);
            else
#endif
            output_line(ctx, "varying vec4 io_%i_%i;", usage, index);
            output_line(ctx, "#define %s io_%i_%i", var, usage, index);
        } // if
        else
        {
            output_line(ctx, "#define %s %s%s%s%s", var, usage_str,
                        arrayleft, index_str, arrayright);
        } // else
        pop_output(ctx);
    } // else if

    else
    {
        fail(ctx, "Unknown shader type");  // state machine should catch this.
    } // else
}